

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::ParseTable(Parser *this,StructDef *struct_def,string *value,uoffset_t *ovalue)

{
  FieldDef *this_00;
  reverse_iterator rVar1;
  size_type_conflict sVar2;
  bool bVar3;
  reference ppFVar4;
  pointer ppVar5;
  size_type_conflict sVar6;
  pointer ppVar7;
  __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
  _Var8;
  char *pcVar9;
  size_t size_00;
  uint8_t *puVar10;
  undefined8 in_R8;
  uoffset_t local_3e8;
  string local_3b0;
  uoffset_t local_38c;
  ulong uStack_388;
  uoffset_t val_44;
  size_t i;
  byte local_375;
  Offset<void> local_374;
  offset_type_conflict oStack_370;
  Offset<void> val_43;
  Offset64<void> local_360;
  Offset64<void> offset_4;
  Offset<void> local_34c;
  offset_type_conflict oStack_348;
  Offset<void> val_42;
  Offset64<void> local_338;
  Offset64<void> offset_3;
  Offset64<void> local_320;
  Offset64<void> val_41;
  Offset64<void> local_308;
  Offset64<void> offset_2;
  Offset<void> local_2f4;
  offset_type_conflict oStack_2f0;
  Offset<void> val_40;
  Offset64<void> local_2e0;
  Offset64<void> offset_1;
  Offset<void> local_2cc;
  offset_type_conflict oStack_2c8;
  Offset<void> val_39;
  Offset64<void> local_2b8;
  Offset64<void> offset;
  double local_2a8;
  double valdef_12;
  double val_38;
  double local_290;
  double val_37;
  double local_280;
  double val_36;
  float local_270;
  float valdef_11;
  float val_35;
  byte local_261;
  float val_34;
  byte local_25a;
  byte local_259;
  float val_33;
  uint64_t valdef_10;
  uint64_t val_32;
  unsigned_long local_240;
  uint64_t val_31;
  unsigned_long local_230;
  uint64_t val_30;
  long local_220;
  int64_t valdef_9;
  int64_t val_29;
  long local_208;
  int64_t val_28;
  long local_1f8;
  int64_t val_27;
  uint local_1e8;
  uint local_1e4;
  uint32_t valdef_8;
  uint32_t val_26;
  byte local_1d5;
  uint32_t val_25;
  byte local_1ce;
  byte local_1cd;
  uint32_t val_24;
  int local_1c8;
  int32_t valdef_7;
  int32_t val_23;
  byte local_1b9;
  int32_t val_22;
  byte local_1b4;
  byte local_1b3;
  unsigned_short local_1b2;
  int32_t val_21;
  unsigned_short local_1ac;
  uint16_t valdef_6;
  uint16_t val_20;
  byte local_1a6;
  byte local_1a5;
  uint16_t val_19;
  short local_1a2;
  uint16_t val_18;
  short local_19e;
  int16_t valdef_5;
  int16_t val_17;
  byte local_198;
  byte local_197;
  int16_t val_16;
  byte local_194;
  uchar local_193;
  int16_t val_15;
  byte local_190;
  byte local_18f;
  uint8_t valdef_4;
  uint8_t val_14;
  byte local_18c;
  uint8_t val_13;
  byte local_18a;
  uint8_t val_12;
  byte local_188;
  byte local_187;
  int8_t valdef_3;
  int8_t val_11;
  byte local_184;
  int8_t val_10;
  byte local_182;
  int8_t val_9;
  byte local_180;
  byte local_17f;
  uint8_t valdef_2;
  uint8_t val_8;
  byte local_17c;
  uint8_t val_7;
  byte local_17a;
  uint8_t val_6;
  byte local_178;
  byte local_177;
  uint8_t valdef_1;
  uint8_t val_5;
  byte local_174;
  uint8_t val_4;
  byte local_172;
  uint8_t val_3;
  uint8_t valdef;
  uint8_t val_2;
  uint8_t val_1;
  FieldDef *pFStack_170;
  uint8_t val;
  FieldDef *field;
  Value *field_value;
  reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
  local_158;
  reverse_iterator it;
  size_t size;
  undefined1 local_138 [4];
  uoffset_t start;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  FieldDef *local_b8;
  FieldDef *parsed_field;
  __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
  local_a8;
  __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
  local_a0;
  __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
  pf_it;
  bool found;
  FieldDef *required_field;
  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
  local_80;
  const_iterator field_it;
  undefined1 local_62 [8];
  CheckedError err;
  size_t fieldn_outer;
  undefined1 local_40 [8];
  ParseDepthGuard depth_guard;
  uoffset_t *ovalue_local;
  string *value_local;
  StructDef *struct_def_local;
  Parser *this_local;
  CheckedError *ce;
  
  depth_guard._8_8_ = in_R8;
  ParseDepthGuard::ParseDepthGuard((ParseDepthGuard *)local_40,(Parser *)struct_def);
  ParseDepthGuard::Check((ParseDepthGuard *)this);
  bVar3 = CheckedError::Check((CheckedError *)this);
  if (!bVar3) {
    CheckedError::~CheckedError((CheckedError *)this);
    stack0xffffffffffffffa0 = 0;
    ParseTableDelimiters<flatbuffers::Parser::ParseTable(flatbuffers::StructDef_const&,std::__cxx11::string*,unsigned_int*)::__0>
              ((Parser *)local_62,(size_t *)struct_def,(StructDef *)(local_62 + 2),
               (anon_class_8_1_8991fb9c)value);
    field_it._M_current._7_1_ = 0;
    CheckedError::CheckedError((CheckedError *)this,(CheckedError *)local_62);
    bVar3 = CheckedError::Check((CheckedError *)this);
    if (bVar3) {
      field_it._M_current._7_1_ = 1;
    }
    if ((field_it._M_current._7_1_ & 1) == 0) {
      CheckedError::~CheckedError((CheckedError *)this);
    }
    if (!bVar3) {
      local_80._M_current =
           (FieldDef **)
           std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::begin
                     ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                      ((long)&value[7].field_2 + 8));
      while( true ) {
        required_field =
             (FieldDef *)
             std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::end
                       ((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *
                        )((long)&value[7].field_2 + 8));
        bVar3 = __gnu_cxx::operator!=
                          (&local_80,
                           (__normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                            *)&required_field);
        sVar2 = stack0xffffffffffffffa0;
        if (!bVar3) break;
        ppFVar4 = __gnu_cxx::
                  __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
                  ::operator*(&local_80);
        this_00 = *ppFVar4;
        bVar3 = FieldDef::IsRequired(this_00);
        if (bVar3) {
          pf_it._M_current._7_1_ = 0;
          local_a8._M_current =
               (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)
               std::
               vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
               ::end((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                      *)&struct_def[5].fields);
          local_a0 = __gnu_cxx::
                     __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
                     ::operator-(&local_a8,stack0xffffffffffffffa0);
          while( true ) {
            parsed_field = (FieldDef *)
                           std::
                           vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                           ::end((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                                  *)&struct_def[5].fields);
            bVar3 = __gnu_cxx::operator!=
                              (&local_a0,
                               (__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
                                *)&parsed_field);
            if (!bVar3) break;
            ppVar5 = __gnu_cxx::
                     __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
                     ::operator->(&local_a0);
            local_b8 = ppVar5->second;
            if (local_b8 == this_00) {
              pf_it._M_current._7_1_ = 1;
              break;
            }
            __gnu_cxx::
            __normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
            ::operator++(&local_a0);
          }
          if ((pf_it._M_current._7_1_ & 1) == 0) {
            std::operator+(&local_118,"required field is missing: ",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           this_00);
            std::operator+(&local_f8,&local_118," in ");
            std::operator+(&local_d8,&local_f8,value);
            Error(this,(string *)struct_def);
            std::__cxx11::string::~string((string *)&local_d8);
            std::__cxx11::string::~string((string *)&local_f8);
            std::__cxx11::string::~string((string *)&local_118);
            goto LAB_00118239;
          }
        }
        __gnu_cxx::
        __normal_iterator<flatbuffers::FieldDef_*const_*,_std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>_>
        ::operator++(&local_80);
      }
      if (((value[8].field_2._M_local_buf[0] & 1U) == 0) ||
         (sVar6 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::
                  size((vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_> *)
                       ((long)&value[7].field_2 + 8)), sVar2 == sVar6)) {
        if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
          local_3e8 = FlatBufferBuilderImpl<false>::StartTable
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count);
        }
        else {
          local_3e8 = FlatBufferBuilderImpl<false>::StartStruct
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(size_t *)((long)&value[8].field_2 + 8));
        }
        it.current._M_current =
             (__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
              )(pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)0x1;
        if ((value[8].field_2._M_local_buf[2] & 1U) != 0) {
          it.current._M_current =
               (__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
                )(pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)0x8;
        }
        for (; it.current._M_current != (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)0x0;
            it.current._M_current =
                 (__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
                  )((ulong)it.current._M_current >> 1)) {
          std::
          vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
          ::rbegin((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                    *)&stack0xfffffffffffffeb0);
          while( true ) {
            std::
            vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
            ::rbegin((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                      *)&field_value);
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
            ::operator+(&local_158,(difference_type)&field_value);
            bVar3 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
                                     *)&stack0xfffffffffffffeb0,&local_158);
            if (!bVar3) break;
            field = (FieldDef *)
                    std::
                    reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
                    ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
                                  *)&stack0xfffffffffffffeb0);
            ppVar7 = std::
                     reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
                     ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
                                   *)&stack0xfffffffffffffeb0);
            rVar1 = it;
            pFStack_170 = ppVar7->second;
            if (((value[8].field_2._M_local_buf[2] & 1U) == 0) ||
               (_Var8._M_current =
                     (pair<flatbuffers::Value,_flatbuffers::FieldDef_*> *)
                     SizeOf(*(BaseType *)&(field->super_Definition).name),
               rVar1.current._M_current ==
               (__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>
                )_Var8._M_current)) {
              switch(*(undefined4 *)&(field->super_Definition).name) {
              case 0:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      local_174 = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_char>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_4);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        local_174 = 1;
                      }
                      if ((local_174 & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_4);
                    }
                  }
                  else {
                    local_177 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_5);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_177 = 1;
                    }
                    if ((local_177 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_178 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&valdef_1);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_178 = 1;
                    }
                    if ((local_178 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,val_5,valdef_1);
                  }
                }
                else {
                  local_172 = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_3);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_172 = 1;
                  }
                  if ((local_172 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_3);
                }
                break;
              case 1:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      local_17c = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_char>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_7);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        local_17c = 1;
                      }
                      if ((local_17c & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_7);
                    }
                  }
                  else {
                    local_17f = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_8);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_17f = 1;
                    }
                    if ((local_17f & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_180 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&valdef_2);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_180 = 1;
                    }
                    if ((local_180 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,val_8,valdef_2);
                  }
                }
                else {
                  local_17a = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_6);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_17a = 1;
                  }
                  if ((local_17a & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_6);
                }
                break;
              case 2:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      local_184 = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_char>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(uchar *)&val_10
                                );
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        local_184 = 1;
                      }
                      if ((local_184 & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_10);
                    }
                  }
                  else {
                    local_187 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(uchar *)&val_11);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_187 = 1;
                    }
                    if ((local_187 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_188 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(uchar *)&valdef_3
                              );
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_188 = 1;
                    }
                    if ((local_188 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,val_11,valdef_3);
                  }
                }
                else {
                  local_182 = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(uchar *)&val_9);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_182 = 1;
                  }
                  if ((local_182 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_9);
                }
                break;
              case 3:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      local_18c = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<signed_char>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(char *)&val_13)
                      ;
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        local_18c = 1;
                      }
                      if ((local_18c & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<signed_char>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_13);
                    }
                  }
                  else {
                    local_18f = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<signed_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(char *)&val_14);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_18f = 1;
                    }
                    if ((local_18f & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_190 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<signed_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(char *)&valdef_4)
                    ;
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_190 = 1;
                    }
                    if ((local_190 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<signed_char>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,val_14,valdef_4);
                  }
                }
                else {
                  local_18a = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<signed_char>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(char *)&val_12);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_18a = 1;
                  }
                  if ((local_18a & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<signed_char,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_12);
                }
                break;
              case 4:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      local_194 = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_char>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_193);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        local_194 = 1;
                      }
                      if ((local_194 & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_193);
                    }
                  }
                  else {
                    local_197 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,
                               (uchar *)((long)&val_16 + 1));
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_197 = 1;
                    }
                    if ((local_197 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_198 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_char>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(uchar *)&val_16);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_198 = 1;
                    }
                    if ((local_198 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_char>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,val_16._1_1_,
                               (uchar)val_16);
                  }
                }
                else {
                  val_15._0_1_ = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_char>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,
                             (uchar *)((long)&val_15 + 1));
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    val_15._0_1_ = 1;
                  }
                  if (((byte)val_15 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_char,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_15._1_1_);
                }
                break;
              case 5:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      val_18._1_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<short>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_19e);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        val_18._1_1_ = 1;
                      }
                      if ((val_18._1_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<short>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_19e);
                    }
                  }
                  else {
                    local_1a5 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<short>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1a2);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_1a5 = 1;
                    }
                    if ((local_1a5 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_1a6 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<short>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(short *)&val_19);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_1a6 = 1;
                    }
                    if ((local_1a6 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<short>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,local_1a2,val_19);
                  }
                }
                else {
                  valdef_5._1_1_ = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<short>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_17);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    valdef_5._1_1_ = 1;
                  }
                  if ((valdef_5._1_1_ & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<short,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_17);
                }
                break;
              case 6:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      val_21._3_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_short>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1ac);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        val_21._3_1_ = 1;
                      }
                      if ((val_21._3_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_short>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_1ac);
                    }
                  }
                  else {
                    local_1b3 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_short>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,
                               (unsigned_short *)&val_21);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_1b3 = 1;
                    }
                    if ((local_1b3 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_1b4 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_short>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1b2);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_1b4 = 1;
                    }
                    if ((local_1b4 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_short>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,(unsigned_short)val_21,
                               local_1b2);
                  }
                }
                else {
                  valdef_6._1_1_ = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_short>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_20);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    valdef_6._1_1_ = 1;
                  }
                  if ((valdef_6._1_1_ & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_short,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_20);
                }
                break;
              case 7:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      valdef_7._3_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<int>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_23);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        valdef_7._3_1_ = 1;
                      }
                      if ((valdef_7._3_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<int>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_23);
                    }
                  }
                  else {
                    local_1cd = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<int>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1c8);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_1cd = 1;
                    }
                    if ((local_1cd & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_1ce = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<int>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,(int *)&val_24);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_1ce = 1;
                    }
                    if ((local_1ce & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<int>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,local_1c8,val_24);
                  }
                }
                else {
                  local_1b9 = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<int>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_22);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_1b9 = 1;
                  }
                  if ((local_1b9 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<int,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_22);
                }
                break;
              case 8:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      valdef_8._3_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_int>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_26);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        valdef_8._3_1_ = 1;
                      }
                      if ((valdef_8._3_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_int>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_26);
                    }
                  }
                  else {
                    val_27._7_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_int>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1e4);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      val_27._7_1_ = 1;
                    }
                    if ((val_27._7_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    val_27._6_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_int>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1e8);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      val_27._6_1_ = 1;
                    }
                    if ((val_27._6_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_int>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,local_1e4,local_1e8);
                  }
                }
                else {
                  local_1d5 = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_int>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_25);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_1d5 = 1;
                  }
                  if ((local_1d5 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_int,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_25);
                }
                break;
              case 9:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      val_29._7_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<long>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_208);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        val_29._7_1_ = 1;
                      }
                      if ((val_29._7_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<long>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_208);
                    }
                  }
                  else {
                    val_30._7_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<long>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&valdef_9);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      val_30._7_1_ = 1;
                    }
                    if ((val_30._7_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    val_30._6_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<long>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_220);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      val_30._6_1_ = 1;
                    }
                    if ((val_30._6_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<long>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,valdef_9,local_220);
                  }
                }
                else {
                  val_28._7_1_ = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<long>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_1f8);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    val_28._7_1_ = 1;
                  }
                  if ((val_28._7_1_ & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<long,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,local_1f8);
                }
                break;
              case 10:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      val_32._7_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<unsigned_long>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_240);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        val_32._7_1_ = 1;
                      }
                      if ((val_32._7_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_240);
                    }
                  }
                  else {
                    local_259 = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_long>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&valdef_10);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_259 = 1;
                    }
                    if ((local_259 & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    local_25a = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<unsigned_long>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,
                               (unsigned_long *)&val_33);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      local_25a = 1;
                    }
                    if ((local_25a & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<unsigned_long>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,valdef_10,_val_33);
                  }
                }
                else {
                  val_31._7_1_ = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<unsigned_long>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_230);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    val_31._7_1_ = 1;
                  }
                  if ((val_31._7_1_ & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<unsigned_long,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,local_230);
                }
                break;
              case 0xb:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      valdef_11._3_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<float>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_35);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        valdef_11._3_1_ = 1;
                      }
                      if ((valdef_11._3_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<float>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,val_35);
                    }
                  }
                  else {
                    val_36._3_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<float>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_270);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      val_36._3_1_ = 1;
                    }
                    if ((val_36._3_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    val_36._2_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<float>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,
                               (float *)((long)&val_36 + 4));
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      val_36._2_1_ = 1;
                    }
                    if ((val_36._2_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<float>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,local_270,val_36._4_4_);
                  }
                }
                else {
                  local_261 = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<float>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&val_34);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_261 = 1;
                  }
                  if ((local_261 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<float,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,val_34);
                }
                break;
              case 0xc:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
                  bVar3 = FieldDef::IsScalarOptional(pFStack_170);
                  if (bVar3) {
                    bVar3 = std::operator!=(&(field->super_Definition).file,"null");
                    if (bVar3) {
                      val_38._7_1_ = 0;
                      pcVar9 = (char *)std::__cxx11::string::c_str();
                      anon_unknown_0::atot<double>
                                ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_290);
                      bVar3 = CheckedError::Check((CheckedError *)this);
                      if (bVar3) {
                        val_38._7_1_ = 1;
                      }
                      if ((val_38._7_1_ & 1) == 0) {
                        CheckedError::~CheckedError((CheckedError *)this);
                      }
                      if (bVar3) goto LAB_00118239;
                      FlatBufferBuilderImpl<false>::AddElement<double>
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,
                                 *(voffset_t *)
                                  &(field->super_Definition).doc_comment.
                                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start,local_290);
                    }
                  }
                  else {
                    offset.o._7_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<double>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&valdef_12);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      offset.o._7_1_ = 1;
                    }
                    if ((offset.o._7_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    offset.o._6_1_ = 0;
                    pcVar9 = (char *)std::__cxx11::string::c_str();
                    anon_unknown_0::atot<double>
                              ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_2a8);
                    bVar3 = CheckedError::Check((CheckedError *)this);
                    if (bVar3) {
                      offset.o._6_1_ = 1;
                    }
                    if ((offset.o._6_1_ & 1) == 0) {
                      CheckedError::~CheckedError((CheckedError *)this);
                    }
                    if (bVar3) goto LAB_00118239;
                    FlatBufferBuilderImpl<false>::AddElement<double>
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count,
                               *(voffset_t *)
                                &(field->super_Definition).doc_comment.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start,valdef_12,local_2a8);
                  }
                }
                else {
                  val_37._7_1_ = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  anon_unknown_0::atot<double>
                            ((anon_unknown_0 *)this,pcVar9,(Parser *)struct_def,&local_280);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    val_37._7_1_ = 1;
                  }
                  if ((val_37._7_1_ & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  FlatBufferBuilderImpl<false>::PushElement<double,unsigned_int>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,local_280);
                }
                break;
              case 0xd:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                bVar3 = IsStruct(&(pFStack_170->value).type);
                if (bVar3) {
                  SerializeStruct((Parser *)struct_def,(pFStack_170->value).type.struct_def,
                                  (Value *)field);
                }
                else if ((pFStack_170->offset64 & 1U) == 0) {
                  Offset<void>::Offset(&local_2cc);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_2cc);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  offset_1.o._4_4_ = local_2cc.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_2cc);
                }
                else {
                  Offset64<void>::Offset64(&local_2b8);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_2b8);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  oStack_2c8 = local_2b8.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_2b8);
                }
                break;
              case 0xe:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                bVar3 = IsStruct(&(pFStack_170->value).type);
                if (bVar3) {
                  SerializeStruct((Parser *)struct_def,(pFStack_170->value).type.struct_def,
                                  (Value *)field);
                }
                else if ((pFStack_170->offset64 & 1U) == 0) {
                  Offset<void>::Offset(&local_2f4);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_2f4);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  offset_2.o._4_4_ = local_2f4.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_2f4);
                }
                else {
                  Offset64<void>::Offset64(&local_2e0);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_2e0);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  oStack_2f0 = local_2e0.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_2e0);
                }
                break;
              case 0xf:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                bVar3 = IsStruct(&(pFStack_170->value).type);
                if (bVar3) {
                  SerializeStruct((Parser *)struct_def,(pFStack_170->value).type.struct_def,
                                  (Value *)field);
                }
                else if ((pFStack_170->offset64 & 1U) == 0) {
                  Offset<void>::Offset(&local_34c);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_34c);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  offset_4.o._4_4_ = local_34c.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_34c);
                }
                else {
                  Offset64<void>::Offset64(&local_338);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_338);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  oStack_348 = local_338.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_338);
                }
                break;
              case 0x10:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                bVar3 = IsStruct(&(pFStack_170->value).type);
                if (bVar3) {
                  SerializeStruct((Parser *)struct_def,(pFStack_170->value).type.struct_def,
                                  (Value *)field);
                }
                else if ((pFStack_170->offset64 & 1U) == 0) {
                  Offset<void>::Offset(&local_374);
                  local_375 = 0;
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_374);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) {
                    local_375 = 1;
                  }
                  if ((local_375 & 1) == 0) {
                    CheckedError::~CheckedError((CheckedError *)this);
                  }
                  if (bVar3) goto LAB_00118239;
                  i._4_4_ = local_374.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_374);
                }
                else {
                  Offset64<void>::Offset64(&local_360);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_360);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  oStack_370 = local_360.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_360);
                }
                break;
              case 0x11:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                puVar10 = (uint8_t *)std::__cxx11::string::c_str();
                size_00 = InlineSize((Type *)field);
                FlatBufferBuilderImpl<false>::PushBytes
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,puVar10,size_00);
                break;
              case 0x12:
                FlatBufferBuilderImpl<false>::Pad
                          ((FlatBufferBuilderImpl<false> *)
                           &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                            super__Rb_tree_header._M_node_count,pFStack_170->padding);
                bVar3 = IsStruct(&(pFStack_170->value).type);
                if (bVar3) {
                  SerializeStruct((Parser *)struct_def,(pFStack_170->value).type.struct_def,
                                  (Value *)field);
                }
                else if ((pFStack_170->offset64 & 1U) == 0) {
                  Offset64<void>::Offset64(&local_320);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_320);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  offset_3.o = local_320.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_320);
                }
                else {
                  Offset64<void>::Offset64(&local_308);
                  pcVar9 = (char *)std::__cxx11::string::c_str();
                  (anonymous_namespace)::atot<flatbuffers::Offset64<void>>
                            ((_anonymous_namespace_ *)this,pcVar9,(Parser *)struct_def,&local_308);
                  bVar3 = CheckedError::Check((CheckedError *)this);
                  if (bVar3) goto LAB_00118239;
                  CheckedError::~CheckedError((CheckedError *)this);
                  val_41.o = local_308.o;
                  FlatBufferBuilderImpl<false>::AddOffset<void>
                            ((FlatBufferBuilderImpl<false> *)
                             &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                              super__Rb_tree_header._M_node_count,
                             *(voffset_t *)
                              &(field->super_Definition).doc_comment.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start,local_308);
                }
              }
            }
            std::
            reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
            ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_*,_std::vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>_>_>
                          *)&stack0xfffffffffffffeb0);
          }
        }
        for (uStack_388 = 0; uStack_388 < stack0xffffffffffffffa0; uStack_388 = uStack_388 + 1) {
          std::
          vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
          ::pop_back((vector<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>,_std::allocator<std::pair<flatbuffers::Value,_flatbuffers::FieldDef_*>_>_>
                      *)&struct_def[5].fields);
        }
        if ((value[8].field_2._M_local_buf[0] & 1U) == 0) {
          local_38c = FlatBufferBuilderImpl<false>::EndTable
                                ((FlatBufferBuilderImpl<false> *)
                                 &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                  super__Rb_tree_header._M_node_count,local_3e8);
          if (depth_guard._8_8_ != 0) {
            *(uoffset_t *)depth_guard._8_8_ = local_38c;
          }
          if (ovalue != (uoffset_t *)0x0) {
            NumToString<unsigned_int>(&local_3b0,local_38c);
            std::__cxx11::string::operator=((string *)ovalue,(string *)&local_3b0);
            std::__cxx11::string::~string((string *)&local_3b0);
          }
        }
        else {
          FlatBufferBuilderImpl<false>::ClearOffsets
                    ((FlatBufferBuilderImpl<false> *)
                     &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                      super__Rb_tree_header._M_node_count);
          FlatBufferBuilderImpl<false>::EndStruct
                    ((FlatBufferBuilderImpl<false> *)
                     &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                      super__Rb_tree_header._M_node_count);
          if (ovalue == (uoffset_t *)0x0) {
            __assert_fail("value",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                          ,0x676,
                          "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                         );
          }
          puVar10 = FlatBufferBuilderImpl<false>::GetCurrentBufferPointer
                              ((FlatBufferBuilderImpl<false> *)
                               &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                                super__Rb_tree_header._M_node_count);
          std::__cxx11::string::assign((char *)ovalue,(ulong)puVar10);
          FlatBufferBuilderImpl<false>::PopBytes
                    ((FlatBufferBuilderImpl<false> *)
                     &struct_def[1].super_Definition.attributes.dict._M_t._M_impl.
                      super__Rb_tree_header._M_node_count,*(size_t *)(value + 9));
          if (depth_guard._8_8_ != 0) {
            __assert_fail("!ovalue",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                          ,0x67d,
                          "CheckedError flatbuffers::Parser::ParseTable(const StructDef &, std::string *, uoffset_t *)"
                         );
          }
        }
        anon_unknown_0::NoError();
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_138,"struct: wrong number of initializers: ",value);
        Error(this,(string *)struct_def);
        std::__cxx11::string::~string((string *)local_138);
      }
    }
LAB_00118239:
    CheckedError::~CheckedError((CheckedError *)local_62);
  }
  ParseDepthGuard::~ParseDepthGuard((ParseDepthGuard *)local_40);
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::ParseTable(const StructDef &struct_def, std::string *value,
                                uoffset_t *ovalue) {
  ParseDepthGuard depth_guard(this);
  ECHECK(depth_guard.Check());

  size_t fieldn_outer = 0;
  auto err = ParseTableDelimiters(
      fieldn_outer, &struct_def,
      [&](const std::string &name, size_t &fieldn,
          const StructDef *struct_def_inner) -> CheckedError {
        if (name == "$schema") {
          ECHECK(Expect(kTokenStringConstant));
          return NoError();
        }
        auto field = struct_def_inner->fields.Lookup(name);
        if (!field) {
          if (!opts.skip_unexpected_fields_in_json) {
            return Error("unknown field: " + name);
          } else {
            ECHECK(SkipAnyJsonValue());
          }
        } else {
          if (IsIdent("null") && !IsScalar(field->value.type.base_type)) {
            ECHECK(Next());  // Ignore this field.
          } else {
            Value val = field->value;
            if (field->flexbuffer) {
              flexbuffers::Builder builder(1024,
                                           flexbuffers::BUILDER_FLAG_SHARE_ALL);
              ECHECK(ParseFlexBufferValue(&builder));
              builder.Finish();
              // Force alignment for nested flexbuffer
              builder_.ForceVectorAlignment(builder.GetSize(), sizeof(uint8_t),
                                            sizeof(largest_scalar_t));
              auto off = builder_.CreateVector(builder.GetBuffer());
              val.constant = NumToString(off.o);
            } else if (field->nested_flatbuffer) {
              ECHECK(
                  ParseNestedFlatbuffer(val, field, fieldn, struct_def_inner));
            } else {
              ECHECK(ParseAnyValue(val, field, fieldn, struct_def_inner, 0));
            }
            // Hardcoded insertion-sort with error-check.
            // If fields are specified in order, then this loop exits
            // immediately.
            auto elem = field_stack_.rbegin();
            for (; elem != field_stack_.rbegin() + fieldn; ++elem) {
              auto existing_field = elem->second;
              if (existing_field == field)
                return Error("field set more than once: " + field->name);
              if (existing_field->value.offset < field->value.offset) break;
            }
            // Note: elem points to before the insertion point, thus .base()
            // points to the correct spot.
            field_stack_.insert(elem.base(), std::make_pair(val, field));
            fieldn++;
          }
        }
        return NoError();
      });
  ECHECK(err);

  // Check if all required fields are parsed.
  for (auto field_it = struct_def.fields.vec.begin();
       field_it != struct_def.fields.vec.end(); ++field_it) {
    auto required_field = *field_it;
    if (!required_field->IsRequired()) { continue; }
    bool found = false;
    for (auto pf_it = field_stack_.end() - fieldn_outer;
         pf_it != field_stack_.end(); ++pf_it) {
      auto parsed_field = pf_it->second;
      if (parsed_field == required_field) {
        found = true;
        break;
      }
    }
    if (!found) {
      return Error("required field is missing: " + required_field->name +
                   " in " + struct_def.name);
    }
  }

  if (struct_def.fixed && fieldn_outer != struct_def.fields.vec.size())
    return Error("struct: wrong number of initializers: " + struct_def.name);

  auto start = struct_def.fixed ? builder_.StartStruct(struct_def.minalign)
                                : builder_.StartTable();

  for (size_t size = struct_def.sortbysize ? sizeof(largest_scalar_t) : 1; size;
       size /= 2) {
    // Go through elements in reverse, since we're building the data backwards.
    // TODO(derekbailey): this doesn't work when there are Offset64 fields, as
    // those have to be built first. So this needs to be changed to iterate over
    // Offset64 then Offset32 fields.
    for (auto it = field_stack_.rbegin();
         it != field_stack_.rbegin() + fieldn_outer; ++it) {
      auto &field_value = it->first;
      auto field = it->second;
      if (!struct_def.sortbysize ||
          size == SizeOf(field_value.type.base_type)) {
        switch (field_value.type.base_type) {
          // clang-format off
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (struct_def.fixed) { \
                CTYPE val; \
                ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                builder_.PushElement(val); \
              } else { \
                if (field->IsScalarOptional()) { \
                  if (field_value.constant != "null") { \
                    CTYPE val; \
                    ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                    builder_.AddElement(field_value.offset, val); \
                  } \
                } else { \
                  CTYPE val, valdef; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  ECHECK(atot(field->value.constant.c_str(), *this, &valdef)); \
                  builder_.AddElement(field_value.offset, val, valdef); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_SCALAR(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
          #define FLATBUFFERS_TD(ENUM, IDLTYPE, CTYPE, ...) \
            case BASE_TYPE_ ## ENUM: \
              builder_.Pad(field->padding); \
              if (IsStruct(field->value.type)) { \
                SerializeStruct(*field->value.type.struct_def, field_value); \
              } else { \
                /* Special case for fields that use 64-bit addressing */ \
                if(field->offset64) { \
                  Offset64<void> offset; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &offset)); \
                  builder_.AddOffset(field_value.offset, offset); \
                } else { \
                  CTYPE val; \
                  ECHECK(atot(field_value.constant.c_str(), *this, &val)); \
                  builder_.AddOffset(field_value.offset, val); \
                } \
              } \
              break;
            FLATBUFFERS_GEN_TYPES_POINTER(FLATBUFFERS_TD)
          #undef FLATBUFFERS_TD
            case BASE_TYPE_ARRAY:
              builder_.Pad(field->padding);
              builder_.PushBytes(
                reinterpret_cast<const uint8_t*>(field_value.constant.c_str()),
                InlineSize(field_value.type));
              break;
            // clang-format on
        }
      }
    }
  }